

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  Pgno *pPVar1;
  int flags;
  bool bVar2;
  int local_7c;
  DbPage *local_78;
  DbPage *pDbPage;
  int a_1;
  int nOvfl;
  Pgno nextPage;
  u32 ovflSize;
  int a;
  int iPage;
  BtShared *pBt;
  MemPage *pPage;
  int local_40;
  int iIdx;
  u32 nKey;
  int rc;
  uchar *aPayload;
  uchar *puStack_28;
  int eOp_local;
  uchar *pBuf_local;
  u32 amt_local;
  u32 offset_local;
  BtCursor *pCur_local;
  
  iIdx = 0;
  pPage._4_4_ = 0;
  pBt = (BtShared *)pCur->apPage[pCur->iPage];
  _a = pCur->pBt;
  aPayload._4_4_ = eOp;
  puStack_28 = pBuf;
  pBuf_local._0_4_ = amt;
  pBuf_local._4_4_ = offset;
  _amt_local = pCur;
  if ((pCur->info).nSize == 0) {
    ovflSize = (u32)pCur->iPage;
    btreeParseCell(pCur->apPage[(int)ovflSize],(uint)pCur->aiIdx[(int)ovflSize],&pCur->info);
    _amt_local->validNKey = '\x01';
  }
  _nKey = (_amt_local->info).pCell + (int)(uint)(_amt_local->info).nHeader;
  if (*(char *)((long)&pBt->pPager + 2) == '\0') {
    local_7c = (int)(_amt_local->info).nKey;
  }
  else {
    local_7c = 0;
  }
  local_40 = local_7c;
  if ((local_7c + (_amt_local->info).nData < pBuf_local._4_4_ + (u32)pBuf_local) ||
     ((pBt->mutex->mutex).__size + _a->usableSize < _nKey + (_amt_local->info).nLocal)) {
    pCur_local._4_4_ = sqlite3CorruptError(0xd11c);
  }
  else {
    if (pBuf_local._4_4_ < (_amt_local->info).nLocal) {
      nextPage = (u32)pBuf_local;
      if ((uint)(_amt_local->info).nLocal < (u32)pBuf_local + pBuf_local._4_4_) {
        nextPage = (_amt_local->info).nLocal - pBuf_local._4_4_;
      }
      iIdx = copyPayload(_nKey + pBuf_local._4_4_,puStack_28,nextPage,aPayload._4_4_,
                         (DbPage *)pBt->pNext);
      pBuf_local._4_4_ = 0;
      puStack_28 = puStack_28 + (int)nextPage;
      pBuf_local._0_4_ = (u32)pBuf_local - nextPage;
    }
    else {
      pBuf_local._4_4_ = pBuf_local._4_4_ - (_amt_local->info).nLocal;
    }
    if ((iIdx == 0) && ((u32)pBuf_local != 0)) {
      nOvfl = _a->usableSize - 4;
      a_1 = sqlite3Get4byte(_nKey + (_amt_local->info).nLocal);
      if ((_amt_local->isIncrblobHandle != '\0') && (_amt_local->aOverflow == (Pgno *)0x0)) {
        pDbPage._4_4_ =
             ((((_amt_local->info).nPayload - (uint)(_amt_local->info).nLocal) + nOvfl) - 1) /
             (uint)nOvfl;
        pPVar1 = (Pgno *)sqlite3MallocZero(pDbPage._4_4_ << 2);
        _amt_local->aOverflow = pPVar1;
        if ((pDbPage._4_4_ != 0) && (_amt_local->aOverflow == (Pgno *)0x0)) {
          iIdx = 7;
        }
      }
      if ((_amt_local->aOverflow != (Pgno *)0x0) &&
         (_amt_local->aOverflow[(ulong)pBuf_local._4_4_ / (ulong)(uint)nOvfl] != 0)) {
        pPage._4_4_ = pBuf_local._4_4_ / (uint)nOvfl;
        a_1 = _amt_local->aOverflow[(int)pPage._4_4_];
        pBuf_local._4_4_ = pBuf_local._4_4_ % (uint)nOvfl;
      }
      while( true ) {
        bVar2 = false;
        if ((iIdx == 0) && (bVar2 = false, (u32)pBuf_local != 0)) {
          bVar2 = a_1 != 0;
        }
        if (!bVar2) break;
        if (_amt_local->aOverflow != (Pgno *)0x0) {
          _amt_local->aOverflow[(int)pPage._4_4_] = a_1;
        }
        if (pBuf_local._4_4_ < (uint)nOvfl) {
          pDbPage._0_4_ = (u32)pBuf_local;
          if ((uint)nOvfl < (u32)pBuf_local + pBuf_local._4_4_) {
            pDbPage._0_4_ = nOvfl - pBuf_local._4_4_;
          }
          flags = 0;
          if (aPayload._4_4_ == 0) {
            flags = 2;
          }
          iIdx = sqlite3PagerAcquire(_a->pPager,a_1,&local_78,flags);
          if (iIdx == 0) {
            _nKey = (u8 *)sqlite3PagerGetData(local_78);
            a_1 = sqlite3Get4byte(_nKey);
            iIdx = copyPayload(_nKey + (pBuf_local._4_4_ + 4),puStack_28,(u32)pDbPage,aPayload._4_4_
                               ,local_78);
            sqlite3PagerUnref(local_78);
            pBuf_local._4_4_ = 0;
          }
          pBuf_local._0_4_ = (u32)pBuf_local - (u32)pDbPage;
          puStack_28 = puStack_28 + (int)(u32)pDbPage;
        }
        else {
          if ((_amt_local->aOverflow == (Pgno *)0x0) ||
             (_amt_local->aOverflow[(int)(pPage._4_4_ + 1)] == 0)) {
            iIdx = getOverflowPage(_a,a_1,(MemPage **)0x0,(Pgno *)&a_1);
          }
          else {
            a_1 = _amt_local->aOverflow[(int)(pPage._4_4_ + 1)];
          }
          pBuf_local._4_4_ = pBuf_local._4_4_ - nOvfl;
        }
        pPage._4_4_ = pPage._4_4_ + 1;
      }
    }
    if ((iIdx == 0) && ((u32)pBuf_local != 0)) {
      pCur_local._4_4_ = sqlite3CorruptError(0xd1a4);
    }
    else {
      pCur_local._4_4_ = iIdx;
    }
  }
  return pCur_local._4_4_;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */ 
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  u32 nKey;
  int iIdx = 0;
  MemPage *pPage = pCur->apPage[pCur->iPage]; /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */

  assert( pPage );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->aiIdx[pCur->iPage]<pPage->nCell );
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pCell + pCur->info.nHeader;
  nKey = (pPage->intKey ? 0 : (int)pCur->info.nKey);

  if( NEVER(offset+amt > nKey+pCur->info.nData) 
   || &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
  ){
    /* Trying to read or write past the end of the data is an error */
    return SQLITE_CORRUPT_BKPT;
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }

  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

#ifndef SQLITE_OMIT_INCRBLOB
    /* If the isIncrblobHandle flag is set and the BtCursor.aOverflow[]
    ** has not been allocated, allocate it now. The array is sized at
    ** one entry for each overflow page in the overflow chain. The
    ** page number of the first overflow page is stored in aOverflow[0],
    ** etc. A value of 0 in the aOverflow[] array means "not yet known"
    ** (the cache is lazily populated).
    */
    if( pCur->isIncrblobHandle && !pCur->aOverflow ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      pCur->aOverflow = (Pgno *)sqlite3MallocZero(sizeof(Pgno)*nOvfl);
      /* nOvfl is always positive.  If it were zero, fetchPayload would have
      ** been used instead of this routine. */
      if( ALWAYS(nOvfl) && !pCur->aOverflow ){
        rc = SQLITE_NOMEM;
      }
    }

    /* If the overflow page-list cache has been allocated and the
    ** entry for the first required overflow page is valid, skip
    ** directly to it.
    */
    if( pCur->aOverflow && pCur->aOverflow[offset/ovflSize] ){
      iIdx = (offset/ovflSize);
      nextPage = pCur->aOverflow[iIdx];
      offset = (offset%ovflSize);
    }
#endif

    for( ; rc==SQLITE_OK && amt>0 && nextPage; iIdx++){

#ifndef SQLITE_OMIT_INCRBLOB
      /* If required, populate the overflow page-list cache. */
      if( pCur->aOverflow ){
        assert(!pCur->aOverflow[iIdx] || pCur->aOverflow[iIdx]==nextPage);
        pCur->aOverflow[iIdx] = nextPage;
      }
#endif

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
#ifndef SQLITE_OMIT_INCRBLOB
        if( pCur->aOverflow && pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        } else 
#endif
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
        sqlite3_file *fd;
#endif
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and 
        **   2) data is required from the start of this overflow page, and
        **   3) the database is file-backed, and
        **   4) there is no open write-transaction, and
        **   5) the database is not a WAL database,
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && pBt->inTransaction==TRANS_READ                     /* (4) */
         && (fd = sqlite3PagerFile(pBt->pPager))->pMethods     /* (3) */
         && pBt->pPage1->aData[19]==0x01                       /* (5) */
        ){
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerAcquire(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_ACQUIRE_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        pBuf += a;
      }
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    return SQLITE_CORRUPT_BKPT;
  }
  return rc;
}